

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_format_value.cpp
# Opt level: O1

string * duckdb::ExceptionFormatValue::Format
                   (string *__return_storage_ptr__,string *msg,
                   vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                   *values)

{
  ExceptionFormatValueType EVar1;
  pointer pEVar2;
  pointer pEVar3;
  vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>,_std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_>
  format_args;
  basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  arg;
  void *local_2d8;
  iterator iStack_2d0;
  basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  *local_2c8;
  anon_union_16_15_055d57a1_for_value<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_278;
  long lStack_268;
  undefined8 uStack_260;
  undefined1 local_258 [504];
  undefined ***local_60;
  ulong local_58;
  void *local_50;
  pointer local_48;
  size_type sStack_40;
  undefined4 local_38;
  
  local_2d8 = (void *)0x0;
  iStack_2d0._M_current =
       (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
        *)0x0;
  local_2c8 = (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
               *)0x0;
  pEVar3 = (values->
           super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (values->
           super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar3 != pEVar2) {
    do {
      EVar1 = pEVar3->type;
      if (EVar1 == FORMAT_VALUE_TYPE_STRING) {
        lStack_268 = CONCAT44(lStack_268._4_4_,0xe);
        local_278.long_long_value = (longlong)(pEVar3->str_val)._M_dataplus._M_p;
        local_278.string.size = (pEVar3->str_val)._M_string_length;
        if (iStack_2d0._M_current == local_2c8) {
          ::std::
          vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
          ::
          _M_realloc_insert<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>
                    ((vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
                      *)&local_2d8,iStack_2d0,
                     (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                      *)&local_278.string);
        }
        else {
LAB_014002a9:
          *(long *)&(iStack_2d0._M_current)->type_ = lStack_268;
          *(undefined8 *)&(iStack_2d0._M_current)->field_0x18 = uStack_260;
          ((iStack_2d0._M_current)->value_).field_0.int_value = local_278.int_value;
          *(undefined4 *)((long)&((iStack_2d0._M_current)->value_).field_0 + 4) =
               local_278.long_long_value._4_4_;
          *(undefined4 *)((long)&((iStack_2d0._M_current)->value_).field_0 + 8) =
               local_278.int128_value._8_4_;
          *(undefined4 *)((long)&((iStack_2d0._M_current)->value_).field_0 + 0xc) =
               local_278.int128_value._12_4_;
          iStack_2d0._M_current = iStack_2d0._M_current + 1;
        }
      }
      else if (EVar1 == FORMAT_VALUE_TYPE_INTEGER) {
        lStack_268 = CONCAT44(lStack_268._4_4_,4);
        local_278.long_long_value = pEVar3->int_val;
        if (iStack_2d0._M_current != local_2c8) goto LAB_014002a9;
        ::std::
        vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
        ::
        _M_realloc_insert<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>
                  ((vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
                    *)&local_2d8,iStack_2d0,
                   (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                    *)&local_278.string);
      }
      else if (EVar1 == FORMAT_VALUE_TYPE_DOUBLE) {
        lStack_268 = CONCAT44(lStack_268._4_4_,0xb);
        local_278.long_long_value = (longlong)pEVar3->dbl_val;
        if (iStack_2d0._M_current != local_2c8) goto LAB_014002a9;
        ::std::
        vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
        ::
        _M_realloc_insert<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>
                  ((vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
                    *)&local_2d8,iStack_2d0,
                   (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                    *)&local_278.string);
      }
      pEVar3 = pEVar3 + 1;
    } while (pEVar3 != pEVar2);
  }
  local_58 = (ulong)((long)iStack_2d0._M_current - (long)local_2d8) >> 5 & 0xffffffff |
             0x8000000000000000;
  lStack_268 = 0;
  local_278.double_value = (double)&PTR_grow_0248f918;
  uStack_260 = 500;
  local_48 = (msg->_M_dataplus)._M_p;
  sStack_40 = msg->_M_string_length;
  local_60 = (undefined ***)&local_278;
  local_50 = local_2d8;
  local_38 = 0;
  local_278.custom.format =
       (_func_void_void_ptr_parse_context_ptr_basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_ptr
        *)local_258;
  duckdb_fmt::v6::
  basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>::
  format<duckdb_fmt::v6::printf_arg_formatter<duckdb_fmt::v6::buffer_range<char>>>
            ((basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>
              *)&local_60);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_278.string.size,
             local_278.custom.format + lStack_268);
  local_278.double_value = (double)&PTR_grow_0248f918;
  if (local_278._8_8_ != local_258) {
    operator_delete(local_278.custom.format);
  }
  if (local_2d8 != (void *)0x0) {
    operator_delete(local_2d8);
  }
  return __return_storage_ptr__;
}

Assistant:

string ExceptionFormatValue::Format(const string &msg, std::vector<ExceptionFormatValue> &values) {
	try {
		std::vector<duckdb_fmt::basic_format_arg<duckdb_fmt::printf_context>> format_args;
		for (auto &val : values) {
			switch (val.type) {
			case ExceptionFormatValueType::FORMAT_VALUE_TYPE_DOUBLE:
				format_args.push_back(duckdb_fmt::internal::make_arg<duckdb_fmt::printf_context>(val.dbl_val));
				break;
			case ExceptionFormatValueType::FORMAT_VALUE_TYPE_INTEGER:
				format_args.push_back(duckdb_fmt::internal::make_arg<duckdb_fmt::printf_context>(val.int_val));
				break;
			case ExceptionFormatValueType::FORMAT_VALUE_TYPE_STRING:
				format_args.push_back(duckdb_fmt::internal::make_arg<duckdb_fmt::printf_context>(val.str_val));
				break;
			}
		}
		return duckdb_fmt::vsprintf(msg, duckdb_fmt::basic_format_args<duckdb_fmt::printf_context>(
		                                     format_args.data(), static_cast<int>(format_args.size())));
	} catch (std::exception &ex) { // LCOV_EXCL_START
		// work-around for oss-fuzz limiting memory which causes issues here
		if (StringUtil::Contains(ex.what(), "fuzz mode")) {
			throw InvalidInputException(msg);
		}
		throw InternalException(std::string("Primary exception: ") + msg +
		                        "\nSecondary exception in ExceptionFormatValue: " + ex.what());
	} // LCOV_EXCL_STOP
}